

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

void __thiscall
ImageT<unsigned_short,_2U>::ImageT(ImageT<unsigned_short,_2U> *this,uint32_t w,uint32_t h)

{
  Color *pCVar1;
  long lVar2;
  undefined8 *puVar3;
  uint32_t p;
  ulong uVar4;
  long lVar5;
  
  (this->super_Image).width = w;
  (this->super_Image).height = h;
  (this->super_Image).transferFunction = KHR_DF_TRANSFER_UNSPECIFIED;
  (this->super_Image).primaries = KHR_DF_PRIMARIES_BT709;
  (this->super_Image)._vptr_Image = (_func_int **)&PTR__ImageT_001a8978;
  pCVar1 = (Color *)malloc((ulong)h * (ulong)w * 4);
  this->pixels = pCVar1;
  if (pCVar1 != (Color *)0x0) {
    this->freePixels = true;
    lVar2 = 0;
    for (uVar4 = 0; uVar4 != h * w; uVar4 = uVar4 + 1) {
      for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
        *(undefined2 *)((long)&this->pixels->field_0 + lVar5 * 2 + lVar2) = 0;
      }
      lVar2 = lVar2 + 4;
    }
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = std::operator<<;
  __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

ImageT(uint32_t w, uint32_t h) : Image(w, h)
    {
        size_t bytes = sizeof(Color) * w * h;
        pixels = (Color*)malloc(bytes);
        if (!pixels)
            throw std::bad_alloc();

        freePixels = true;

        for (uint32_t p = 0; p < w * h; ++p)
            for(uint32_t c = 0; c < componentCount; ++c)
                pixels[p].comps[c] = componentType{0};
    }